

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::UnaryExpr<const_slang::SourceLibrary_*&>::streamReconstructedExpression
          (UnaryExpr<const_slang::SourceLibrary_*&> *this,ostream *os)

{
  SourceLibrary *in_stack_ffffffffffffffc8;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  StringMaker<slang::SourceLibrary_const*,void>::convert<slang::SourceLibrary_const>
            (in_stack_ffffffffffffffc8);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }